

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O0

TValue * lj_meta_tset(lua_State *L,cTValue *o,cTValue *k)

{
  cTValue *pcVar1;
  TValue *pTVar2;
  ulong uVar3;
  cTValue *in_RDX;
  cTValue *in_RSI;
  lua_State *in_RDI;
  cTValue *tv;
  GCtab *t;
  cTValue *mo;
  int loop;
  TValue tmp;
  GCobj *o_2;
  GCobj *o_1;
  undefined4 in_stack_ffffffffffffff58;
  ErrMsg in_stack_ffffffffffffff5c;
  cTValue *in_stack_ffffffffffffff60;
  cTValue *in_stack_ffffffffffffff68;
  cTValue *in_stack_ffffffffffffff78;
  cTValue *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int iVar4;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  iVar4 = 0;
  do {
    if (99 < iVar4) {
      lj_err_msg((lua_State *)&in_stack_ffffffffffffff60->field_2,in_stack_ffffffffffffff5c);
    }
    if ((in_RSI->field_2).it == 0xfffffff4) {
      in_stack_ffffffffffffff78 = (cTValue *)(ulong)((GCRef *)&(in_RSI->u32).lo)->gcptr32;
      pcVar1 = lj_tab_get((lua_State *)&in_RDX->field_2,
                          (GCtab *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          (cTValue *)CONCAT44(iVar4,in_stack_ffffffffffffff88));
      if ((pcVar1->field_2).it != 0xffffffff) {
        *(undefined1 *)((long)&(in_stack_ffffffffffffff78->field_2).it + 2) = 0;
        if (((in_stack_ffffffffffffff78->field_2).it & 4) == 0) {
          return pcVar1;
        }
        uVar3 = (ulong)(in_RDI->glref).ptr32;
        *(byte *)&(in_stack_ffffffffffffff78->field_2).it =
             (byte)(in_stack_ffffffffffffff78->field_2).it & 0xfb;
        *(undefined4 *)((long)in_stack_ffffffffffffff78 + 0xc) = *(undefined4 *)(uVar3 + 0x3c);
        *(int *)(uVar3 + 0x3c) = (int)in_stack_ffffffffffffff78;
        return pcVar1;
      }
      if (in_stack_ffffffffffffff78[2].u32.lo == 0) {
        in_stack_ffffffffffffff68 = (cTValue *)0x0;
      }
      else if ((*(byte *)((ulong)in_stack_ffffffffffffff78[2].u32.lo + 6) & 2) == 0) {
        in_stack_ffffffffffffff60 =
             lj_meta_cache((GCtab *)&in_stack_ffffffffffffff68->field_2,
                           (MMS)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                           (GCstr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff68 = in_stack_ffffffffffffff60;
      }
      else {
        in_stack_ffffffffffffff60 = (cTValue *)0x0;
        in_stack_ffffffffffffff68 = in_stack_ffffffffffffff60;
      }
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff68;
      if (in_stack_ffffffffffffff68 == (cTValue *)0x0) {
        *(undefined1 *)((long)&(in_stack_ffffffffffffff78->field_2).it + 2) = 0;
        if (((in_stack_ffffffffffffff78->field_2).it & 4) != 0) {
          uVar3 = (ulong)(in_RDI->glref).ptr32;
          *(byte *)&(in_stack_ffffffffffffff78->field_2).it =
               (byte)(in_stack_ffffffffffffff78->field_2).it & 0xfb;
          *(undefined4 *)((long)in_stack_ffffffffffffff78 + 0xc) = *(undefined4 *)(uVar3 + 0x3c);
          *(int *)(uVar3 + 0x3c) = (int)in_stack_ffffffffffffff78;
        }
        if (pcVar1 != (cTValue *)((ulong)(in_RDI->glref).ptr32 + 0x68)) {
          return pcVar1;
        }
        if ((in_RDX->field_2).it == 0xffffffff) {
          lj_err_msg((lua_State *)&in_stack_ffffffffffffff60->field_2,in_stack_ffffffffffffff5c);
        }
        if (((in_RDX->field_2).it < 0xfffeffff) &&
           ((in_RDX->n != in_RDX->n || (NAN(in_RDX->n) || NAN(in_RDX->n))))) {
          lj_err_msg((lua_State *)&in_stack_ffffffffffffff60->field_2,in_stack_ffffffffffffff5c);
        }
        pTVar2 = lj_tab_newkey((lua_State *)CONCAT44(iVar4,in_stack_ffffffffffffff88),(GCtab *)0x0,
                               in_stack_ffffffffffffff78);
        return pTVar2;
      }
    }
    else {
      in_stack_ffffffffffffff80 =
           lj_meta_lookup((lua_State *)CONCAT44(iVar4,in_stack_ffffffffffffff88),
                          in_stack_ffffffffffffff80,(MMS)((ulong)in_stack_ffffffffffffff78 >> 0x20))
      ;
      if ((in_stack_ffffffffffffff80->field_2).it == 0xffffffff) {
        lj_err_optype((lua_State *)&in_RSI->field_2,in_RDX,in_stack_ffffffffffffff94);
      }
    }
    if ((in_stack_ffffffffffffff80->field_2).it == 0xfffffff7) {
      pTVar2 = mmcall(in_RDI,lj_cont_nop,in_stack_ffffffffffffff80,in_RSI,in_RDX);
      in_RDI->top = pTVar2;
      return (TValue *)0x0;
    }
    in_stack_ffffffffffffff94 = (in_stack_ffffffffffffff80->u32).hi;
    in_stack_ffffffffffffff90 = (in_stack_ffffffffffffff80->u32).lo;
    in_RSI = (cTValue *)&stack0xffffffffffffff90;
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

TValue *lj_meta_tset(lua_State *L, cTValue *o, cTValue *k)
{
  TValue tmp;
  int loop;
  for (loop = 0; loop < LJ_MAX_IDXCHAIN; loop++) {
    cTValue *mo;
    if (LJ_LIKELY(tvistab(o))) {
      GCtab *t = tabV(o);
      cTValue *tv = lj_tab_get(L, t, k);
      if (LJ_LIKELY(!tvisnil(tv))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	return (TValue *)tv;
      } else if (!(mo = lj_meta_fast(L, tabref(t->metatable), MM_newindex))) {
	t->nomm = 0;  /* Invalidate negative metamethod cache. */
	lj_gc_anybarriert(L, t);
	if (tv != niltv(L))
	  return (TValue *)tv;
	if (tvisnil(k)) lj_err_msg(L, LJ_ERR_NILIDX);
	else if (tvisint(k)) { setnumV(&tmp, (lua_Number)intV(k)); k = &tmp; }
	else if (tvisnum(k) && tvisnan(k)) lj_err_msg(L, LJ_ERR_NANIDX);
	return lj_tab_newkey(L, t, k);
      }
    } else if (tvisnil(mo = lj_meta_lookup(L, o, MM_newindex))) {
      lj_err_optype(L, o, LJ_ERR_OPINDEX);
      return NULL;  /* unreachable */
    }
    if (tvisfunc(mo)) {
      L->top = mmcall(L, lj_cont_nop, mo, o, k);
      /* L->top+2 = v filled in by caller. */
      return NULL;  /* Trigger metamethod call. */
    }
    copyTV(L, &tmp, mo);
    o = &tmp;
  }
  lj_err_msg(L, LJ_ERR_SETLOOP);
  return NULL;  /* unreachable */
}